

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor_handle.hpp
# Opt level: O0

file_descriptor_handle * __thiscall
io::posix::file_descriptor_handle::operator=
          (file_descriptor_handle *this,file_descriptor_handle *other)

{
  file_descriptor_handle *other_local;
  file_descriptor_handle *this_local;
  
  if (other != this) {
    std::swap<int>(&this->fd_,&other->fd_);
    std::swap<bool>(&this->delete_,&other->delete_);
  }
  return this;
}

Assistant:

file_descriptor_handle& operator=(file_descriptor_handle&& other) noexcept
    {
        if (&other != this) {
            std::swap(fd_, other.fd_);
            std::swap(delete_, other.delete_);
        }
        return *this;
    }